

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

MemoryInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemoryInstanceInfo
          (MemoryInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  bool bVar1;
  Memory *this_00;
  __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  Export *this_02;
  ModuleRunnerBase<wasm::ModuleRunner> *this_03;
  Name *pNVar3;
  ModuleRunner *pMVar4;
  Export *memoryExport;
  mapped_type *importedInstance;
  Memory *memory;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  this_00 = Module::getMemory(this->wasm,name);
  bVar1 = Importable::imported(&this_00->super_Importable);
  if (bVar1) {
    this_01 = (__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              ::at(&this->linkedInstances,&(this_00->super_Importable).module);
    peVar2 = std::__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    this_02 = Module::getExport((peVar2->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm,
                                (Name)(this_00->super_Importable).base.super_IString.str);
    this_03 = &std::
               __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01)->super_ModuleRunnerBase<wasm::ModuleRunner>;
    pNVar3 = Export::getInternalName(this_02);
    getMemoryInstanceInfo(__return_storage_ptr__,this_03,(Name)(pNVar3->super_IString).str);
  }
  else {
    pMVar4 = self(this);
    __return_storage_ptr__->instance = pMVar4;
    (__return_storage_ptr__->name).super_IString.str._M_len = name.super_IString.str._M_len;
    (__return_storage_ptr__->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  return __return_storage_ptr__;
}

Assistant:

MemoryInstanceInfo getMemoryInstanceInfo(Name name) {
    auto* memory = wasm.getMemory(name);
    if (memory->imported()) {
      auto& importedInstance = linkedInstances.at(memory->module);
      auto* memoryExport = importedInstance->wasm.getExport(memory->base);
      return importedInstance->getMemoryInstanceInfo(
        *memoryExport->getInternalName());
    }

    return MemoryInstanceInfo{self(), name};
  }